

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalarimage.hpp
# Opt level: O1

void __thiscall ScalarImage::ScalarImage(ScalarImage *this,string *filename)

{
  int iVar1;
  float *retval_from_stbi_load;
  float *pfVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  int n;
  string ext;
  int local_44;
  string local_40;
  
  suffix(&local_40,filename);
  github111116::ConsoleLogger::log<char[21],std::__cxx11::string>
            (&console,(char (*) [21])"Loading ScalarImage:",filename);
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_40);
      if (iVar1 != 0) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar3 = "ScalarImage load: unrecognized format";
        __cxa_throw(puVar3,&char_const*::typeinfo,0);
      }
    }
  }
  retval_from_stbi_load = stbi_loadf((filename->_M_dataplus)._M_p,&this->w,&this->h,&local_44,0);
  if (retval_from_stbi_load != (float *)0x0) {
    uVar5 = (long)this->h * (long)this->w;
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar5) {
      uVar4 = uVar5 * 4;
    }
    pfVar2 = (float *)operator_new__(uVar4);
    this->pixels = pfVar2;
    if (0 < (int)uVar5) {
      uVar4 = 0;
      iVar1 = local_44;
      do {
        pfVar2[uVar4] = retval_from_stbi_load[(long)iVar1 + -1];
        uVar4 = uVar4 + 1;
        iVar1 = iVar1 + local_44;
      } while ((uVar5 & 0xffffffff) != uVar4);
    }
    stbi_image_free(retval_from_stbi_load);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = "ScalarImage load failed";
  __cxa_throw(puVar3,&char_const*::typeinfo,0);
}

Assistant:

ScalarImage(const std::string& filename)
	{
		std::string ext = suffix(filename);
		console.log("Loading ScalarImage:", filename);
		if (ext == "hdr" || ext == "png" || ext == "jpg") {
			// use the last channel
			int n;
			float* raw = stbi_loadf(filename.c_str(), &w, &h, &n, 0);
			if (raw == NULL) throw "ScalarImage load failed";
			pixels = new float[w*h];
			for (int i=0; i<w*h; ++i)
				pixels[i] = raw[i*n+n-1];
			stbi_image_free(raw);
			return;
		}
		throw "ScalarImage load: unrecognized format";
	}